

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

void image_manipulation::crop_image(clip_image_u8 *image,clip_image_u8 *dst,int x,int y,int w,int h)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  
  dst->nx = w;
  dst->ny = h;
  this = &dst->buf;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(long)(w * h * 3));
  if (0 < h) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = (ulong)(uint)w;
      lVar5 = lVar2;
      iVar6 = x;
      if (0 < w) {
        do {
          lVar1 = (long)(image->nx * y + iVar6) * 3;
          (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar5] =
               (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar1];
          (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar5 + 1] =
               (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar1 + 1];
          (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar5 + 2] =
               (image->buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar1 + 2];
          iVar6 = iVar6 + 1;
          lVar5 = lVar5 + 3;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = uVar3 + 1;
      y = y + 1;
      lVar2 = lVar2 + (ulong)(uint)w * 3;
    } while (uVar3 != (uint)h);
  }
  return;
}

Assistant:

static void crop_image(const clip_image_u8 & image, clip_image_u8 & dst, int x, int y, int w, int h) {
        dst.nx = w;
        dst.ny = h;
        dst.buf.resize(3 * w * h);

        for (int i = 0; i < h; ++i) {
            for (int j = 0; j < w; ++j) {
                int src_idx = 3 * ((y + i)*image.nx + (x + j));
                int dst_idx = 3 * (i*w + j);
                dst.buf[dst_idx]     = image.buf[src_idx];
                dst.buf[dst_idx + 1] = image.buf[src_idx + 1];
                dst.buf[dst_idx + 2] = image.buf[src_idx + 2];
            }
        }
    }